

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O0

int bundle_remove_conn(connectbundle *bundle,connectdata *conn)

{
  Curl_llist_element *local_28;
  Curl_llist_element *curr;
  connectdata *conn_local;
  connectbundle *bundle_local;
  
  local_28 = (bundle->conn_list).head;
  while( true ) {
    if (local_28 == (Curl_llist_element *)0x0) {
      return 0;
    }
    if ((connectdata *)local_28->ptr == conn) break;
    local_28 = local_28->next;
  }
  Curl_llist_remove(&bundle->conn_list,local_28,(void *)0x0);
  bundle->num_connections = bundle->num_connections - 1;
  conn->bundle = (connectbundle *)0x0;
  return 1;
}

Assistant:

static int bundle_remove_conn(struct connectbundle *bundle,
                              struct connectdata *conn)
{
  struct Curl_llist_element *curr;

  curr = bundle->conn_list.head;
  while(curr) {
    if(curr->ptr == conn) {
      Curl_llist_remove(&bundle->conn_list, curr, NULL);
      bundle->num_connections--;
      conn->bundle = NULL;
      return 1; /* we removed a handle */
    }
    curr = curr->next;
  }
  DEBUGASSERT(0);
  return 0;
}